

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O1

ICommandQueueVk * __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::LockCommandQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                   *this,SoftwareQueueIndex QueueInd)

{
  CommandQueue *pCVar1;
  int iVar2;
  char (*in_RCX) [27];
  string msg;
  string local_38;
  
  if (this->m_CmdQueueCount <= (ulong)QueueInd.m_Value) {
    FormatString<char[26],char[27]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x80c319,in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"LockCommandQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x10f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  pCVar1 = this->m_CommandQueues;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(pCVar1 + QueueInd.m_Value));
  if (iVar2 == 0) {
    return *(ICommandQueueVk **)((long)(pCVar1 + QueueInd.m_Value) + 0x30);
  }
  std::__throw_system_error(iVar2);
}

Assistant:

CommandQueueType* LockCommandQueue(SoftwareQueueIndex QueueInd)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        auto& Queue = m_CommandQueues[QueueInd];
        Queue.Mtx.lock();
        return Queue.CmdQueue;
    }